

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

uint32_t __thiscall soul::heart::Parser::parseProcessorArraySize(Parser *this)

{
  uint uVar1;
  CompileMessage local_70;
  uint local_24;
  undefined1 local_20 [4];
  int32_t arraySize;
  CodeLocation errorLocation;
  Parser *this_local;
  
  errorLocation.location.data = (char *)this;
  CodeLocation::CodeLocation
            ((CodeLocation *)local_20,
             &(this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ).location);
  uVar1 = parseInt32(this);
  local_24 = uVar1;
  if ((0 < (int)uVar1) && (uVar1 < 0x101)) {
    CodeLocation::~CodeLocation((CodeLocation *)local_20);
    return uVar1;
  }
  Errors::illegalArraySize<>();
  CodeLocation::throwError((CodeLocation *)local_20,&local_70);
}

Assistant:

uint32_t parseProcessorArraySize()
    {
        auto errorLocation = location;
        auto arraySize = parseInt32();

        if (arraySize <= 0 || (size_t) arraySize > AST::maxProcessorArraySize)
            errorLocation.throwError (Errors::illegalArraySize());

        return (uint32_t) arraySize;
    }